

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_iterator.cpp
# Opt level: O0

void __thiscall
duckdb::TupleDataChunkIterator::TupleDataChunkIterator
          (TupleDataChunkIterator *this,TupleDataCollection *collection_p,
          TupleDataPinProperties properties,idx_t chunk_idx_from,idx_t chunk_idx_to,bool init_heap_p
          )

{
  size_type sVar1;
  idx_t iVar2;
  ulong in_RCX;
  undefined1 in_DL;
  long in_RSI;
  long *in_RDI;
  ulong in_R8;
  byte in_R9B;
  value_type *segment;
  idx_t segment_idx;
  idx_t overall_chunk_index;
  size_type in_stack_ffffffffffffff48;
  TupleDataChunkIterator *in_stack_ffffffffffffff50;
  TupleDataScanState *in_stack_ffffffffffffff60;
  ulong uVar3;
  ulong local_40;
  ulong local_38;
  
  *in_RDI = in_RSI;
  *(byte *)(in_RDI + 1) = in_R9B & 1;
  TupleDataScanState::TupleDataScanState(in_stack_ffffffffffffff60);
  *(undefined1 *)(in_RDI + 0xc) = in_DL;
  local_38 = 0;
  local_40 = 0;
  while( true ) {
    sVar1 = ::std::vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>::size
                      ((vector<duckdb::TupleDataSegment,_std::allocator<duckdb::TupleDataSegment>_>
                        *)(*in_RDI + 0x38));
    if (sVar1 <= local_40) break;
    vector<duckdb::TupleDataSegment,_false>::operator[]
              ((vector<duckdb::TupleDataSegment,_false> *)in_stack_ffffffffffffff50,
               in_stack_ffffffffffffff48);
    if (local_38 <= in_RCX) {
      iVar2 = TupleDataSegment::ChunkCount((TupleDataSegment *)0x1648c1d);
      if (in_RCX <= local_38 + iVar2) {
        in_RDI[2] = local_40;
        in_RDI[3] = in_RCX - local_38;
      }
    }
    if (local_38 <= in_R8) {
      uVar3 = local_38;
      iVar2 = TupleDataSegment::ChunkCount((TupleDataSegment *)0x1648cb2);
      if (in_R8 <= uVar3 + iVar2) {
        in_RDI[4] = local_40;
        in_RDI[5] = in_R8 - local_38;
      }
    }
    in_stack_ffffffffffffff50 =
         (TupleDataChunkIterator *)TupleDataSegment::ChunkCount((TupleDataSegment *)0x1648cfc);
    local_38 = (long)&in_stack_ffffffffffffff50->collection + local_38;
    local_40 = local_40 + 1;
  }
  Reset(in_stack_ffffffffffffff50);
  return;
}

Assistant:

TupleDataChunkIterator::TupleDataChunkIterator(TupleDataCollection &collection_p, TupleDataPinProperties properties,
                                               idx_t chunk_idx_from, idx_t chunk_idx_to, bool init_heap_p)
    : collection(collection_p), init_heap(init_heap_p) {
	state.pin_state.properties = properties;
	D_ASSERT(chunk_idx_from < chunk_idx_to);
	D_ASSERT(chunk_idx_to <= collection.ChunkCount());
	idx_t overall_chunk_index = 0;
	for (idx_t segment_idx = 0; segment_idx < collection.segments.size(); segment_idx++) {
		const auto &segment = collection.segments[segment_idx];
		if (chunk_idx_from >= overall_chunk_index && chunk_idx_from <= overall_chunk_index + segment.ChunkCount()) {
			// We start in this segment
			start_segment_idx = segment_idx;
			start_chunk_idx = chunk_idx_from - overall_chunk_index;
		}
		if (chunk_idx_to >= overall_chunk_index && chunk_idx_to <= overall_chunk_index + segment.ChunkCount()) {
			// We end in this segment
			end_segment_idx = segment_idx;
			end_chunk_idx = chunk_idx_to - overall_chunk_index;
		}
		overall_chunk_index += segment.ChunkCount();
	}

	Reset();
}